

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ac3Codec.cpp
# Opt level: O3

uint8_t * AC3Codec::findFrame(uint8_t *buffer,uint8_t *end)

{
  if (buffer < end + -1 && buffer != (uint8_t *)0x0) {
    do {
      if ((*buffer == '\v') && (buffer[1] == 'w')) {
        return buffer;
      }
      buffer = buffer + 1;
    } while (buffer != end + -1);
  }
  return (uint8_t *)0x0;
}

Assistant:

uint8_t *AC3Codec::findFrame(uint8_t *buffer, const uint8_t *end)
{
    if (buffer == nullptr)
        return nullptr;
    uint8_t *curBuf = buffer;
    while (curBuf < end - 1)
    {
        if (*curBuf == 0x0B && curBuf[1] == 0x77)
            return curBuf;
        curBuf++;
    }
    return nullptr;
}